

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resultvalue.cpp
# Opt level: O0

bool __thiscall ResultValue::operator==(ResultValue *this,ResultValue *rhs)

{
  code *pcVar1;
  Complex *pCVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  bool local_31;
  ResultValue *rhs_local;
  ResultValue *this_local;
  
  if (this->mType == rhs->mType) {
    switch(this->mType) {
    case NONE:
      this_local._7_1_ = true;
      break;
    case FLOAT:
      std::abs((int)this);
      this_local._7_1_ = extraout_XMM0_Qa <= 1e-10;
      break;
    case INTEGER:
      this_local._7_1_ = this->mIntValue == rhs->mIntValue;
      break;
    case COMPLEX:
      std::complex<double>::real_abi_cxx11_(&this->mComplexValue);
      pCVar2 = &rhs->mComplexValue;
      std::complex<double>::real_abi_cxx11_(pCVar2);
      std::abs((int)pCVar2);
      local_31 = false;
      if (extraout_XMM0_Qa_00 <= 1e-10) {
        std::complex<double>::imag_abi_cxx11_(&this->mComplexValue);
        pCVar2 = &rhs->mComplexValue;
        std::complex<double>::imag_abi_cxx11_(pCVar2);
        std::abs((int)pCVar2);
        local_31 = extraout_XMM0_Qa_01 <= 1e-10;
      }
      this_local._7_1_ = local_31;
      break;
    default:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ResultValue::operator==(const ResultValue& rhs) const {
	if (mType == rhs.mType) {
		switch (mType) {
			case ResultValueType::NONE:
				return true;
			case ResultValueType::FLOAT:
				return std::abs(mFloatValue - rhs.mFloatValue) <= EPSILON;
			case ResultValueType::INTEGER:
				return mIntValue == rhs.mIntValue;
			case ResultValueType::COMPLEX:
				return std::abs(mComplexValue.real() - rhs.mComplexValue.real()) <= EPSILON
					&& std::abs(mComplexValue.imag() - rhs.mComplexValue.imag()) <= EPSILON;
		}
	} else {
		return false;
	}
}